

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<const_slang::ast::Expression_*>::reallocateTo
          (SmallVectorBase<const_slang::ast::Expression_*> *this,size_type newCapacity)

{
  Expression **__last;
  EVP_PKEY_CTX *ctx;
  Expression **in_RSI;
  SmallVectorBase<const_slang::ast::Expression_*> *in_RDI;
  pointer newData;
  
  __last = (Expression **)operator_new(0x9720c6);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::uninitialized_move<slang::ast::Expression_const**,slang::ast::Expression_const**>
            (in_RSI,__last,(Expression **)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }